

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.cc
# Opt level: O3

DH * d2i_DHparams(DH **a,uchar **pp,long length)

{
  DH *pDVar1;
  CBS cbs;
  CBS local_28;
  
  if (length < 0) {
    pDVar1 = (DH *)0x0;
  }
  else {
    local_28.data = *pp;
    local_28.len = length;
    pDVar1 = (DH *)DH_parse_parameters(&local_28);
    if (pDVar1 != (DH *)0x0) {
      if (a != (DH **)0x0) {
        DH_free(*a);
        *a = pDVar1;
      }
      *pp = local_28.data;
    }
  }
  return pDVar1;
}

Assistant:

DH *d2i_DHparams(DH **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  DH *ret = DH_parse_parameters(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    DH_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}